

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

string * __thiscall
cmSystemTools::EscapeWindowsShellArgument_abi_cxx11_
          (string *__return_storage_ptr__,cmSystemTools *this,char *arg,int shell_flags)

{
  uint uVar1;
  char *out;
  char local_buffer [1024];
  allocator local_429;
  char local_428 [1024];
  
  uVar1 = cmsysSystem_Shell_GetArgumentSizeForWindows((char *)this,(int)arg);
  out = local_428;
  if (0x400 < (int)uVar1) {
    out = (char *)operator_new__((ulong)uVar1);
  }
  cmsysSystem_Shell_GetArgumentForWindows((char *)this,out,(int)arg);
  std::__cxx11::string::string((string *)__return_storage_ptr__,out,&local_429);
  if (out != local_428) {
    operator_delete__(out);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::EscapeWindowsShellArgument(const char* arg,
                                                      int shell_flags)
{
  char local_buffer[1024];
  char* buffer = local_buffer;
  int size = cmsysSystem_Shell_GetArgumentSizeForWindows(arg, shell_flags);
  if(size > 1024)
    {
    buffer = new char[size];
    }
  cmsysSystem_Shell_GetArgumentForWindows(arg, buffer, shell_flags);
  std::string result(buffer);
  if(buffer != local_buffer)
    {
    delete [] buffer;
    }
  return result;
}